

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O1

optional<pbrt::ShapeSample> * __thiscall
pbrt::Triangle::Sample
          (optional<pbrt::ShapeSample> *__return_storage_ptr__,Triangle *this,
          ShapeSampleContext *ctx,Point2f u)

{
  uint uVar1;
  ulong uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  long lVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  byte bVar13;
  ulong uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  anon_struct_8_0_00000001_for___align aVar18;
  undefined1 auVar19 [16];
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  Float *extraout_RDX;
  Float *extraout_RDX_00;
  Float *extraout_RDX_01;
  Float *extraout_RDX_02;
  Float *extraout_RDX_03;
  Float *extraout_RDX_04;
  Float *pFVar24;
  long lVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 in_ZmmResult [64];
  undefined1 auVar42 [48];
  undefined1 auVar38 [64];
  undefined1 auVar40 [64];
  Float FVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  undefined8 in_XMM0_Qb;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [64];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar70 [60];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  uint uVar95;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  float fVar96;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  float fVar99;
  undefined1 in_ZMM21 [64];
  Point3f p;
  optional<pbrt::ShapeSample> ss;
  Float triPDF;
  float local_188;
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  aligned_storage_t<sizeof(pbrt::ShapeSample),_alignof(pbrt::ShapeSample)> local_b8;
  bool local_60;
  undefined1 local_58 [16];
  Tuple3<pbrt::Point3,_float> local_40;
  undefined1 auVar39 [64];
  undefined1 auVar41 [64];
  undefined1 auVar57 [56];
  undefined1 auVar69 [64];
  array<float,_3> aVar100;
  
  auVar33 = in_ZMM21._0_16_;
  local_178._8_8_ = in_XMM0_Qb;
  local_178._0_8_ = u.super_Tuple2<pbrt::Point2,_float>;
  lVar22 = *(long *)(*(long *)(allMeshes + 8) + (long)this->meshIndex * 8);
  lVar25 = *(long *)(lVar22 + 8);
  lVar20 = (long)this->triIndex;
  lVar21 = (long)*(int *)(lVar25 + lVar20 * 0xc);
  lVar7 = *(long *)(lVar22 + 0x10);
  uVar1 = *(uint *)(lVar7 + lVar21 * 0xc);
  lVar23 = (long)*(int *)(lVar25 + 4 + lVar20 * 0xc);
  uVar95 = *(uint *)(lVar7 + lVar23 * 0xc);
  local_168._8_8_ = 0;
  local_168._0_8_ = *(ulong *)(lVar7 + 4 + lVar21 * 0xc);
  local_158._8_8_ = 0;
  local_158._0_8_ = *(ulong *)(lVar7 + 4 + lVar23 * 0xc);
  lVar21 = (long)*(int *)(lVar25 + 8 + lVar20 * 0xc);
  uVar2 = *(ulong *)(lVar7 + lVar21 * 0xc);
  fVar47 = *(float *)(lVar7 + 8 + lVar21 * 0xc);
  auVar37 = ZEXT416((uint)fVar47);
  auVar29._0_4_ =
       (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low;
  auVar29._4_4_ =
       (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
  auVar29._8_4_ =
       (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
  auVar29._12_4_ =
       (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
  uVar3 = *(undefined8 *)
           &(ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high
  ;
  auVar29 = vinsertps_avx(auVar29,ZEXT416((uint)(ctx->pi).super_Point3<pbrt::Interval>.
                                                super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high),
                          0x10);
  auVar32._0_4_ = (float)uVar3 + auVar29._0_4_;
  auVar32._4_4_ = (float)((ulong)uVar3 >> 0x20) + auVar29._4_4_;
  auVar32._8_4_ = auVar29._8_4_ + 0.0;
  auVar32._12_4_ = auVar29._12_4_ + 0.0;
  auVar30._8_4_ = 0x3f000000;
  auVar30._0_8_ = 0x3f0000003f000000;
  auVar30._12_4_ = 0x3f000000;
  auVar42 = in_ZmmResult._16_48_;
  auVar29 = vmulps_avx512vl(auVar32,auVar30);
  local_b8._8_4_ =
       ((ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low +
       (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) *
       0.5;
  uVar3 = vmovlps_avx(auVar29);
  local_b8._0_4_ = (undefined4)uVar3;
  local_b8._4_4_ = (undefined4)((ulong)uVar3 >> 0x20);
  FVar43 = SolidAngle(this,(Point3f *)&local_b8.__align);
  if ((FVar43 < 0.0002) || (6.22 < FVar43)) {
    Sample((optional<pbrt::ShapeSample> *)&local_b8.__align,this,u);
    if (local_60 == false) {
      LogFatal<char_const(&)[4]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                 ,0xea,"Check failed: %s",(char (*) [4])0x2c8dc3c);
    }
    local_b8._24_4_ = ctx->time;
    auVar33._4_4_ = local_b8._12_4_;
    auVar33._0_4_ = local_b8._8_4_;
    auVar33._8_4_ = local_b8._16_4_;
    auVar33._12_4_ = local_b8._20_4_;
    fVar96 = ((float)local_b8._0_4_ + (float)local_b8._4_4_) * 0.5 -
             ((ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.
              low + (ctx->pi).super_Point3<pbrt::Interval>.
                    super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high) * 0.5;
    auVar37._0_4_ =
         (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
    auVar37._4_4_ =
         (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
    auVar37._8_4_ =
         (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low;
    auVar37._12_4_ =
         (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high;
    auVar29 = vinsertps_avx(auVar33,ZEXT416((uint)local_b8._20_4_),0x10);
    auVar58._0_4_ = ((float)local_b8._12_4_ + auVar29._0_4_) * 0.5;
    auVar58._4_4_ = ((float)local_b8._16_4_ + auVar29._4_4_) * 0.5;
    auVar58._8_4_ = (auVar29._8_4_ + 0.0) * 0.5;
    auVar58._12_4_ = (auVar29._12_4_ + 0.0) * 0.5;
    uVar3 = *(undefined8 *)
             &(ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.
              high;
    auVar29 = vinsertps_avx(auVar37,ZEXT416((uint)(ctx->pi).super_Point3<pbrt::Interval>.
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high)
                            ,0x10);
    auVar31._0_4_ = ((float)uVar3 + auVar29._0_4_) * 0.5;
    auVar31._4_4_ = ((float)((ulong)uVar3 >> 0x20) + auVar29._4_4_) * 0.5;
    auVar31._8_4_ = (auVar29._8_4_ + 0.0) * 0.5;
    auVar31._12_4_ = (auVar29._12_4_ + 0.0) * 0.5;
    auVar30 = vsubps_avx(auVar58,auVar31);
    auVar59._0_4_ = auVar30._0_4_ * auVar30._0_4_;
    auVar59._4_4_ = auVar30._4_4_ * auVar30._4_4_;
    fVar45 = auVar30._8_4_;
    auVar59._8_4_ = fVar45 * fVar45;
    fVar46 = auVar30._12_4_;
    auVar59._12_4_ = fVar46 * fVar46;
    auVar29 = vmovshdup_avx(auVar59);
    fVar47 = fVar96 * fVar96 + auVar59._0_4_ + auVar29._0_4_;
    if ((fVar47 != 0.0) || (NAN(fVar47))) {
      if (fVar47 < 0.0) {
        fVar47 = sqrtf(fVar47);
      }
      else {
        auVar29 = vsqrtss_avx(ZEXT416((uint)fVar47),ZEXT416((uint)fVar47));
        fVar47 = auVar29._0_4_;
      }
      if (local_60 == false) {
        LogFatal<char_const(&)[4]>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                   ,0xea,"Check failed: %s",(char (*) [4])0x2c8dc3c);
      }
      auVar74._0_8_ = auVar30._0_8_ ^ 0x8000000080000000;
      auVar74._8_4_ = -fVar45;
      auVar74._12_4_ = -fVar46;
      auVar78._4_4_ = fVar47;
      auVar78._0_4_ = fVar47;
      auVar78._8_4_ = fVar47;
      auVar78._12_4_ = fVar47;
      auVar29 = vdivps_avx(auVar74,auVar78);
      auVar79._4_4_ = local_b8._48_4_;
      auVar79._0_4_ = local_b8._44_4_;
      auVar79._8_8_ = 0;
      auVar85._0_4_ = auVar29._0_4_ * (float)local_b8._44_4_;
      auVar85._4_4_ = auVar29._4_4_ * (float)local_b8._48_4_;
      auVar85._8_4_ = auVar29._8_4_ * 0.0;
      auVar85._12_4_ = auVar29._12_4_ * 0.0;
      uVar2 = CONCAT44(auVar85._4_4_,auVar85._0_4_);
      auVar61._0_8_ = uVar2 ^ 0x8000000080000000;
      auVar61._8_4_ = -auVar85._8_4_;
      auVar61._12_4_ = -auVar85._12_4_;
      auVar30 = vpermi2ps_avx512vl(_DAT_003d1540,auVar85,auVar61);
      auVar29 = vfmadd231ps_fma(auVar30,auVar79,auVar29);
      auVar29 = vhaddps_avx(auVar29,auVar29);
      auVar29 = vfnmadd231ss_fma(auVar29,ZEXT416((uint)(fVar96 / fVar47)),
                                 ZEXT416((uint)local_b8._40_4_));
      auVar35._8_4_ = 0x7fffffff;
      auVar35._0_8_ = 0x7fffffff7fffffff;
      auVar35._12_4_ = 0x7fffffff;
      auVar37 = vandps_avx512vl(auVar29,auVar35);
      auVar34._0_4_ =
           (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low;
      auVar34._4_4_ =
           (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
      auVar34._8_4_ =
           (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
      auVar34._12_4_ =
           (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
      auVar36._4_4_ = local_b8._4_4_;
      auVar36._0_4_ = local_b8._0_4_;
      auVar36._8_4_ = local_b8._8_4_;
      auVar36._12_4_ = local_b8._12_4_;
      auVar19._4_4_ = local_b8._8_4_;
      auVar19._0_4_ = local_b8._4_4_;
      auVar19._8_4_ = local_b8._12_4_;
      auVar19._12_4_ = local_b8._16_4_;
      fVar47 = ((ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.
                low + (ctx->pi).super_Point3<pbrt::Interval>.
                      super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high) * 0.5 -
               ((float)local_b8._8_4_ + (float)local_b8._12_4_) * 0.5;
      auVar29 = vinsertps_avx(auVar34,ZEXT416((uint)(ctx->pi).super_Point3<pbrt::Interval>.
                                                    super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low
                                             ),0x10);
      auVar30 = vinsertps_avx(*(undefined1 (*) [16])
                               &(ctx->pi).super_Point3<pbrt::Interval>.
                                super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high,
                              ZEXT416((uint)(ctx->pi).super_Point3<pbrt::Interval>.
                                            super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high),0x10)
      ;
      auVar62._0_4_ = (auVar29._0_4_ + auVar30._0_4_) * 0.5;
      auVar62._4_4_ = (auVar29._4_4_ + auVar30._4_4_) * 0.5;
      auVar62._8_4_ = (auVar29._8_4_ + auVar30._8_4_) * 0.5;
      auVar62._12_4_ = (auVar29._12_4_ + auVar30._12_4_) * 0.5;
      auVar29 = vinsertps_avx(auVar36,ZEXT416((uint)local_b8._16_4_),0x10);
      auVar30 = vinsertps_avx(auVar19,ZEXT416((uint)local_b8._20_4_),0x10);
      auVar75._0_4_ = (auVar29._0_4_ + auVar30._0_4_) * 0.5;
      auVar75._4_4_ = (auVar29._4_4_ + auVar30._4_4_) * 0.5;
      auVar75._8_4_ = (auVar29._8_4_ + auVar30._8_4_) * 0.5;
      auVar75._12_4_ = (auVar29._12_4_ + auVar30._12_4_) * 0.5;
      auVar29 = vsubps_avx(auVar62,auVar75);
      auVar63._0_4_ = auVar29._0_4_ * auVar29._0_4_;
      auVar63._4_4_ = auVar29._4_4_ * auVar29._4_4_;
      auVar63._8_4_ = auVar29._8_4_ * auVar29._8_4_;
      auVar63._12_4_ = auVar29._12_4_ * auVar29._12_4_;
      auVar29 = vmovshdup_avx(auVar63);
      fVar47 = (float)local_b8._80_4_ /
               (auVar37._0_4_ / (auVar63._0_4_ + fVar47 * fVar47 + auVar29._0_4_));
      if (ABS(fVar47) != INFINITY) {
        __return_storage_ptr__->set = local_60;
        aVar18._4_4_ = local_b8._4_4_;
        aVar18._0_4_ = local_b8._0_4_;
        (__return_storage_ptr__->optionalValue).__align = aVar18;
        *(ulong *)((long)&__return_storage_ptr__->optionalValue + 8) =
             CONCAT44(local_b8._12_4_,local_b8._8_4_);
        *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0x10) =
             CONCAT44(local_b8._20_4_,local_b8._16_4_);
        *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0x18) =
             CONCAT44(local_b8._28_4_,local_b8._24_4_);
        *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0x20) =
             CONCAT44(local_b8._36_4_,local_b8._32_4_);
        *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0x28) =
             CONCAT44(local_b8._44_4_,local_b8._40_4_);
        *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0x30) =
             CONCAT44(local_b8._52_4_,local_b8._48_4_);
        *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = local_b8._56_8_;
        *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) = local_b8._64_8_;
        *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = 0;
        *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = local_b8._72_8_;
        *(float *)((long)&__return_storage_ptr__->optionalValue + 0x50) = fVar47;
        return __return_storage_ptr__;
      }
    }
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x50) = 0;
    *(undefined8 *)&__return_storage_ptr__->set = 0;
    (__return_storage_ptr__->optionalValue).__align = (anon_struct_8_0_00000001_for___align)0x0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
    return __return_storage_ptr__;
  }
  pFVar24 = extraout_RDX;
  if ((((ctx->ns).super_Tuple3<pbrt::Normal3,_float>.x == 0.0) &&
      (fVar45 = (ctx->ns).super_Tuple3<pbrt::Normal3,_float>.y, fVar45 == 0.0)) && (!NAN(fVar45))) {
    fVar45 = (ctx->ns).super_Tuple3<pbrt::Normal3,_float>.z;
    bVar27 = NAN(fVar45);
    bVar28 = fVar45 == 0.0;
    bVar26 = fVar45 < 0.0;
    if ((bVar28) && (!bVar27)) {
      local_188 = 1.0;
      goto LAB_002ea571;
    }
  }
  fVar45 = ((ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low
           + (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.
             high) * 0.5;
  auVar5._0_4_ = (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y
                 .low;
  auVar5._4_4_ = (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y
                 .high;
  auVar5._8_4_ = (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z
                 .low;
  auVar5._12_4_ =
       (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = uVar2;
  fVar96 = (float)uVar2 - fVar45;
  uVar3 = *(undefined8 *)
           &(ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high
  ;
  auVar29 = vinsertps_avx(auVar5,ZEXT416((uint)(ctx->pi).super_Point3<pbrt::Interval>.
                                               super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high),
                          0x10);
  auVar71._0_4_ = (float)uVar3 + auVar29._0_4_;
  auVar71._4_4_ = (float)((ulong)uVar3 >> 0x20) + auVar29._4_4_;
  auVar71._8_4_ = auVar29._8_4_ + 0.0;
  auVar71._12_4_ = auVar29._12_4_ + 0.0;
  auVar11._8_4_ = 0x3f000000;
  auVar11._0_8_ = 0x3f0000003f000000;
  auVar11._12_4_ = 0x3f000000;
  auVar30 = vmulps_avx512vl(auVar71,auVar11);
  auVar32 = vsubps_avx(local_158,auVar30);
  auVar82._0_4_ = auVar32._0_4_ * auVar32._0_4_;
  auVar82._4_4_ = auVar32._4_4_ * auVar32._4_4_;
  auVar82._8_4_ = auVar32._8_4_ * auVar32._8_4_;
  auVar82._12_4_ = auVar32._12_4_ * auVar32._12_4_;
  auVar29 = vmovshdup_avx(auVar15);
  fVar48 = auVar29._0_4_ - auVar30._0_4_;
  auVar29 = vmovshdup_avx(auVar30);
  fVar99 = fVar47 - auVar29._0_4_;
  auVar31 = vsubps_avx(local_168,auVar30);
  auVar72._0_4_ = auVar31._0_4_ * auVar31._0_4_;
  auVar72._4_4_ = auVar31._4_4_ * auVar31._4_4_;
  auVar72._8_4_ = auVar31._8_4_ * auVar31._8_4_;
  auVar72._12_4_ = auVar31._12_4_ * auVar31._12_4_;
  auVar29 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar95),0x10);
  auVar50._4_4_ = fVar45;
  auVar50._0_4_ = fVar45;
  auVar50._8_4_ = fVar45;
  auVar50._12_4_ = fVar45;
  auVar58 = vsubps_avx(auVar29,auVar50);
  auVar51._0_4_ = auVar58._0_4_ * auVar58._0_4_;
  auVar51._4_4_ = auVar58._4_4_ * auVar58._4_4_;
  auVar51._8_4_ = auVar58._8_4_ * auVar58._8_4_;
  auVar51._12_4_ = auVar58._12_4_ * auVar58._12_4_;
  auVar29 = vmovshdup_avx(auVar51);
  auVar30 = vmovshdup_avx(auVar82);
  fVar45 = auVar29._0_4_ + auVar82._0_4_ + auVar30._0_4_;
  auVar29 = vmovshdup_avx(auVar72);
  fVar46 = auVar51._0_4_ + auVar72._0_4_ + auVar29._0_4_;
  if (fVar46 < 0.0) {
    local_58._0_4_ = fVar99 * fVar99;
    fVar44 = sqrtf(fVar46);
    pFVar24 = extraout_RDX_00;
    fVar46 = (float)local_58._0_4_;
  }
  else {
    auVar29 = vsqrtss_avx(ZEXT416((uint)fVar46),ZEXT416((uint)fVar46));
    fVar44 = auVar29._0_4_;
    fVar46 = fVar99 * fVar99;
  }
  fVar46 = fVar96 * fVar96 + fVar48 * fVar48 + fVar46;
  auVar92._4_4_ = fVar44;
  auVar92._0_4_ = fVar44;
  auVar92._8_4_ = fVar44;
  auVar92._12_4_ = fVar44;
  if (fVar45 < 0.0) {
    local_58 = auVar92;
    fVar45 = sqrtf(fVar45);
    pFVar24 = extraout_RDX_01;
    auVar92 = local_58;
  }
  else {
    auVar29 = vsqrtss_avx(ZEXT416((uint)fVar45),ZEXT416((uint)fVar45));
    fVar45 = auVar29._0_4_;
  }
  auVar30 = vdivps_avx(auVar31,auVar92);
  auVar52._4_4_ = fVar45;
  auVar52._0_4_ = fVar45;
  auVar52._8_4_ = fVar45;
  auVar52._12_4_ = fVar45;
  auVar29 = vblendps_avx(auVar92,auVar52,2);
  auVar29 = vdivps_avx(auVar58,auVar29);
  auVar32 = vdivps_avx(auVar32,auVar52);
  if (fVar46 < 0.0) {
    fVar45 = sqrtf(fVar46);
    pFVar24 = extraout_RDX_02;
  }
  else {
    auVar31 = vsqrtss_avx(ZEXT416((uint)fVar46),ZEXT416((uint)fVar46));
    fVar45 = auVar31._0_4_;
  }
  auVar60._0_4_ = fVar96 / fVar45;
  auVar60._4_12_ = SUB6012((undefined1  [60])0x0,0);
  auVar73._0_4_ = fVar48 / fVar45;
  auVar73._4_12_ = SUB6012((undefined1  [60])0x0,0);
  uVar8._0_4_ = (ctx->ns).super_Tuple3<pbrt::Normal3,_float>.y;
  uVar8._4_4_ = (ctx->ns).super_Tuple3<pbrt::Normal3,_float>.z;
  auVar77._8_8_ = 0;
  auVar77._0_8_ = uVar8;
  auVar83._0_4_ = auVar32._0_4_ * (float)(undefined4)uVar8;
  auVar83._4_4_ = auVar32._4_4_ * (float)uVar8._4_4_;
  auVar83._8_4_ = auVar32._8_4_ * 0.0;
  auVar83._12_4_ = auVar32._12_4_ * 0.0;
  uVar14 = CONCAT44(auVar83._4_4_,auVar83._0_4_);
  auVar93._0_8_ = uVar14 ^ 0x8000000080000000;
  auVar93._8_4_ = -auVar83._8_4_;
  auVar93._12_4_ = -auVar83._12_4_;
  auVar31 = vpermt2ps_avx512vl(auVar83,_DAT_003d1540,auVar93);
  auVar32 = vfmadd231ps_fma(auVar31,auVar77,auVar32);
  auVar94._0_4_ = auVar30._0_4_ * (float)(undefined4)uVar8;
  auVar94._4_4_ = auVar30._4_4_ * (float)uVar8._4_4_;
  auVar94._8_4_ = auVar30._8_4_ * 0.0;
  auVar94._12_4_ = auVar30._12_4_ * 0.0;
  uVar8 = CONCAT44(auVar94._4_4_,auVar94._0_4_);
  auVar88._0_8_ = uVar8 ^ 0x8000000080000000;
  auVar88._8_4_ = -auVar94._8_4_;
  auVar88._12_4_ = -auVar94._12_4_;
  auVar31 = vpermt2ps_avx512vl(auVar94,_DAT_003d1540,auVar88);
  auVar30 = vfmadd231ps_fma(auVar31,auVar77,auVar30);
  auVar30 = vhaddps_avx(auVar30,auVar32);
  fVar46 = (ctx->ns).super_Tuple3<pbrt::Normal3,_float>.x;
  auVar89._4_4_ = fVar46;
  auVar89._0_4_ = fVar46;
  auVar89._8_4_ = fVar46;
  auVar89._12_4_ = fVar46;
  auVar32 = vmovshdup_avx(auVar77);
  auVar30 = vshufps_avx(auVar30,auVar30,0xe8);
  auVar29 = vfmadd213ps_fma(auVar29,auVar89,auVar30);
  auVar84._8_4_ = 0x7fffffff;
  auVar84._0_8_ = 0x7fffffff7fffffff;
  auVar84._12_4_ = 0x7fffffff;
  auVar29 = vandps_avx(auVar29,auVar84);
  auVar12._8_4_ = 0x3c23d70a;
  auVar12._0_8_ = 0x3c23d70a3c23d70a;
  auVar12._12_4_ = 0x3c23d70a;
  uVar8 = vcmpps_avx512vl(auVar29,auVar12,0xe);
  bVar13 = (byte)(uVar8 >> 1);
  auVar30 = vshufps_avx(auVar29,auVar29,0xf5);
  auVar59 = SUB6416(ZEXT464(0x3c23d70a),0);
  auVar39._16_48_ = auVar42;
  auVar39._0_16_ = auVar59;
  auVar38._4_60_ = auVar39._4_60_;
  auVar38._0_4_ =
       (float)((uint)(bVar13 & 1) * auVar30._0_4_ + (uint)!(bool)(bVar13 & 1) * 0x3c23d70a);
  auVar31 = auVar38._0_16_;
  auVar58 = ZEXT416((uint)((fVar99 / fVar45) * auVar32._0_4_));
  auVar30 = vfmadd213ss_fma(auVar73,auVar77,auVar58);
  auVar32 = vfmsub213ss_fma(ZEXT416((uint)(fVar99 / fVar45)),auVar32,auVar58);
  auVar30 = vfmadd231ss_fma(ZEXT416((uint)(auVar30._0_4_ + auVar32._0_4_)),auVar89,auVar60);
  auVar30 = vandps_avx(auVar30,auVar84);
  auVar30 = vmaxss_avx(auVar30,auVar59);
  auVar41._16_48_ = auVar42;
  auVar41._0_16_ = auVar59;
  auVar40._4_60_ = auVar41._4_60_;
  auVar40._0_4_ =
       (float)((uint)((byte)uVar8 & 1) * auVar29._0_4_ + (uint)!(bool)((byte)uVar8 & 1) * 0x3c23d70a
              );
  auVar32 = vmovshdup_avx(local_178);
  fVar45 = auVar38._0_4_ + auVar38._0_4_;
  auVar29 = ZEXT816(0) << 0x40;
  fVar46 = auVar32._0_4_;
  if (((fVar46 != 0.0) || (NAN(fVar46))) || ((fVar45 != 0.0 || (NAN(fVar45))))) {
    fVar96 = auVar40._0_4_ + auVar30._0_4_;
    auVar29 = vfmadd231ss_fma(ZEXT416((uint)(fVar46 * fVar96 * fVar96)),
                              ZEXT416((uint)(fVar45 * fVar45)),ZEXT416((uint)(1.0 - fVar46)));
    if (auVar29._0_4_ < 0.0) {
      fVar48 = sqrtf(auVar29._0_4_);
      auVar30 = ZEXT416((uint)auVar30._0_4_);
      pFVar24 = extraout_RDX_03;
    }
    else {
      auVar29 = vsqrtss_avx(auVar29,auVar29);
      fVar48 = auVar29._0_4_;
    }
    auVar29 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),
                         ZEXT416((uint)((fVar46 * (fVar45 + fVar96)) / (fVar45 + fVar48))));
  }
  fVar48 = auVar29._0_4_;
  fVar46 = 1.0 - fVar48;
  auVar58 = vfmadd231ss_fma(ZEXT416((uint)(auVar40._0_4_ * fVar48)),ZEXT416((uint)fVar46),auVar31);
  auVar32 = ZEXT816(0) << 0x20;
  fVar99 = u.super_Tuple2<pbrt::Point2,_float>.x;
  fVar96 = auVar58._0_4_;
  if ((((fVar99 != 0.0) || (NAN(fVar99))) || (fVar96 != 0.0)) || (NAN(fVar96))) {
    auVar32 = vfmadd231ss_fma(ZEXT416((uint)(fVar48 * auVar30._0_4_)),ZEXT416((uint)fVar46),auVar31)
    ;
    fVar44 = auVar32._0_4_;
    auVar32 = vfmadd231ss_fma(ZEXT416((uint)(fVar99 * fVar44 * fVar44)),
                              ZEXT416((uint)(fVar96 * fVar96)),ZEXT416((uint)(1.0 - fVar99)));
    if (auVar32._0_4_ < 0.0) {
      fVar49 = sqrtf(auVar32._0_4_);
      auVar30 = ZEXT416((uint)auVar30._0_4_);
      pFVar24 = extraout_RDX_04;
    }
    else {
      auVar32 = vsqrtss_avx(auVar32,auVar32);
      fVar49 = auVar32._0_4_;
    }
    auVar32 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),
                         ZEXT416((uint)((fVar99 * (fVar96 + fVar44)) / (fVar96 + fVar49))));
  }
  auVar29 = vinsertps_avx(auVar32,auVar29,0x10);
  u.super_Tuple2<pbrt::Point2,_float> = auVar29._0_8_;
  fVar96 = auVar32._0_4_;
  bVar27 = NAN(fVar96);
  bVar28 = fVar96 == 0.0;
  bVar26 = 0.0 < fVar96;
  if (0.0 <= fVar96) {
    bVar27 = NAN(fVar96);
    bVar28 = fVar96 == 1.0;
    bVar26 = fVar96 < 1.0;
    if (fVar96 <= 1.0) {
      bVar27 = NAN(fVar48);
      bVar28 = fVar48 == 0.0;
      bVar26 = 0.0 < fVar48;
      if (0.0 <= fVar48) {
        bVar27 = NAN(fVar48);
        bVar28 = fVar48 == 1.0;
        bVar26 = fVar48 < 1.0;
        if (fVar48 <= 1.0) {
          local_188 = auVar40._0_4_ + fVar45 + auVar30._0_4_;
          bVar27 = NAN(local_188);
          bVar28 = local_188 == 0.0;
          bVar26 = local_188 < 0.0;
          if ((!bVar28) || (bVar27)) {
            auVar29 = vfmadd231ss_fma(ZEXT416((uint)(auVar38._0_4_ * fVar46 * fVar96)),auVar31,
                                      ZEXT416((uint)(fVar46 * (1.0 - fVar96))));
            auVar29 = vfmadd213ss_fma(auVar40._0_16_,ZEXT416((uint)(fVar48 * (1.0 - fVar96))),
                                      auVar29);
            auVar29 = vfmadd213ss_fma(auVar30,ZEXT416((uint)(fVar48 * fVar96)),auVar29);
            local_188 = (auVar29._0_4_ * 4.0) / local_188;
          }
          else {
            local_188 = 1.0;
          }
          goto LAB_002ea571;
        }
      }
    }
  }
  local_188 = 0.0;
LAB_002ea571:
  uVar3 = vmovlps_avx(local_168);
  local_b8._4_4_ = (undefined4)uVar3;
  local_b8._8_4_ = (undefined4)((ulong)uVar3 >> 0x20);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = uVar2;
  auVar29 = vunpcklpd_avx(local_158,auVar16);
  local_b8._16_4_ = auVar29._0_4_;
  local_b8._20_4_ = auVar29._4_4_;
  local_b8._24_4_ = auVar29._8_4_;
  local_b8._28_4_ = auVar29._12_4_;
  auVar6._0_4_ = (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x
                 .low;
  auVar6._4_4_ = (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x
                 .high;
  auVar6._8_4_ = (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y
                 .low;
  auVar6._12_4_ =
       (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
  uVar3 = *(undefined8 *)
           &(ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high
  ;
  auVar29 = vinsertps_avx(auVar6,ZEXT416((uint)(ctx->pi).super_Point3<pbrt::Interval>.
                                               super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high),
                          0x10);
  auVar53._0_4_ = (float)uVar3 + auVar29._0_4_;
  auVar53._4_4_ = (float)((ulong)uVar3 >> 0x20) + auVar29._4_4_;
  auVar53._8_4_ = auVar29._8_4_ + 0.0;
  auVar53._12_4_ = auVar29._12_4_ + 0.0;
  auVar9._8_4_ = 0x3f000000;
  auVar9._0_8_ = 0x3f0000003f000000;
  auVar9._12_4_ = 0x3f000000;
  auVar29 = vmulps_avx512vl(auVar53,auVar9);
  p.super_Tuple3<pbrt::Point3,_float>._0_8_ = auVar29._0_8_;
  p.super_Tuple3<pbrt::Point3,_float>.z =
       ((ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low +
       (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) *
       0.5;
  auVar70 = (undefined1  [60])0x0;
  auVar57 = ZEXT856(auVar29._8_8_);
  local_b8._0_4_ = uVar1;
  local_b8._12_4_ = uVar95;
  local_b8._32_4_ = fVar47;
  aVar100 = SampleSphericalTriangle
                      ((pbrt *)&local_b8.__align,
                       (array<pbrt::Point3<float>,_3> *)&stack0xffffffffffffffcc,p,u,pFVar24);
  auVar69._0_4_ = aVar100.values[2];
  auVar69._4_60_ = auVar70;
  auVar56._0_8_ = aVar100.values._0_8_;
  auVar56._8_56_ = auVar57;
  auVar30 = vxorps_avx512vl(auVar33,auVar33);
  auVar29 = vucomiss_avx512f(auVar30);
  if ((!bVar28) || (bVar27)) {
    auVar32 = vinsertps_avx512f(local_158,local_168,0x4c);
    fVar45 = aVar100.values[0];
    auVar80._0_4_ = fVar45 * auVar32._0_4_;
    auVar80._4_4_ = aVar100.values[1] * auVar32._4_4_;
    auVar80._8_4_ = auVar57._0_4_ * auVar32._8_4_;
    auVar80._12_4_ = auVar57._4_4_ * auVar32._12_4_;
    auVar86._8_4_ = 0x7fffffff;
    auVar86._0_8_ = 0x7fffffff7fffffff;
    auVar86._12_4_ = 0x7fffffff;
    auVar32 = vandps_avx(auVar80,auVar86);
    auVar58 = vmovshdup_avx(auVar80);
    auVar33 = vandps_avx(auVar58,auVar86);
    auVar59 = vmovshdup_avx(auVar56._0_16_);
    fVar46 = auVar59._0_4_;
    fVar47 = (1.0 - fVar45) - fVar46;
    auVar31 = vmulss_avx512f(auVar37,ZEXT416((uint)fVar47));
    auVar31 = vandps_avx(auVar31,auVar86);
    local_b8._8_4_ = (auVar32._0_4_ + auVar33._0_4_ + auVar31._0_4_) * 3.57628e-07;
    auVar54._4_4_ = uVar1;
    auVar54._0_4_ = uVar1;
    auVar54._8_4_ = uVar1;
    auVar54._12_4_ = uVar1;
    auVar32 = vpermt2ps_avx512vl(local_168,SUB6416(ZEXT464(4),0),auVar54);
    auVar98._0_4_ = auVar32._0_4_ * fVar45;
    auVar98._4_4_ = auVar32._4_4_ * fVar45;
    auVar98._8_4_ = auVar32._8_4_ * fVar45;
    auVar98._12_4_ = auVar32._12_4_ * fVar45;
    auVar32 = vandps_avx(auVar98,auVar86);
    auVar33 = vpermi2ps_avx512vl(SUB6416(ZEXT464(4),0),local_158,ZEXT416(uVar95));
    auVar97._0_4_ = fVar46 * auVar33._0_4_;
    auVar97._4_4_ = auVar59._4_4_ * auVar33._4_4_;
    auVar97._8_4_ = auVar59._8_4_ * auVar33._8_4_;
    auVar97._12_4_ = auVar59._12_4_ * auVar33._12_4_;
    auVar33 = vandps_avx(auVar97,auVar86);
    auVar34 = vbroadcastss_avx512vl(ZEXT416((uint)fVar47));
    auVar17._8_8_ = 0;
    auVar17._0_8_ = uVar2;
    auVar31 = vmulps_avx512vl(auVar17,auVar34);
    auVar31 = vandps_avx(auVar31,auVar86);
    auVar87._0_4_ = auVar32._0_4_ + auVar33._0_4_ + auVar31._0_4_;
    auVar87._4_4_ = auVar32._4_4_ + auVar33._4_4_ + auVar31._4_4_;
    auVar87._8_4_ = auVar32._8_4_ + auVar33._8_4_ + auVar31._8_4_;
    auVar87._12_4_ = auVar32._12_4_ + auVar33._12_4_ + auVar31._12_4_;
    auVar10._8_4_ = 0x34c00005;
    auVar10._0_8_ = 0x34c0000534c00005;
    auVar10._12_4_ = 0x34c00005;
    auVar32 = vmulps_avx512vl(auVar87,auVar10);
    uVar3 = vmovlps_avx(auVar32);
    local_b8._0_4_ = (undefined4)uVar3;
    local_b8._4_4_ = (undefined4)((ulong)uVar3 >> 0x20);
    auVar32 = vmulss_avx512f(auVar37,auVar69._0_16_);
    local_40.z = auVar32._0_4_ + auVar80._0_4_ + auVar58._0_4_;
    auVar64._4_4_ = auVar69._0_4_;
    auVar64._0_4_ = auVar69._0_4_;
    auVar64._8_4_ = auVar69._0_4_;
    auVar64._12_4_ = auVar69._0_4_;
    auVar32 = vmulps_avx512vl(auVar17,auVar64);
    auVar65._0_4_ = auVar32._0_4_ + auVar98._0_4_ + auVar97._0_4_;
    auVar65._4_4_ = auVar32._4_4_ + auVar98._4_4_ + auVar97._4_4_;
    auVar65._8_4_ = auVar32._8_4_ + auVar98._8_4_ + auVar97._8_4_;
    auVar65._12_4_ = auVar32._12_4_ + auVar98._12_4_ + auVar97._12_4_;
    local_40._0_8_ = vmovlps_avx(auVar65);
    auVar32 = vinsertps_avx512f(auVar37,auVar17,0x1c);
    auVar33 = vpermt2ps_avx512vl(auVar17,_DAT_003d14a0,ZEXT416(uVar95));
    auVar37 = vblendps_avx(local_168,auVar54,2);
    auVar35 = vsubps_avx512vl(auVar33,auVar37);
    auVar36 = vsubps_avx512vl(local_158,local_168);
    auVar37 = vinsertps_avx(auVar54,local_168,0x4c);
    auVar33 = vsubps_avx(auVar32,auVar37);
    auVar37 = vmovshdup_avx(auVar33);
    auVar32 = vmovshdup_avx(auVar35);
    auVar58 = ZEXT416((uint)(auVar36._0_4_ * auVar37._0_4_));
    auVar31 = vfmsub213ss_fma(auVar32,auVar35,auVar58);
    auVar58 = vfnmadd213ss_fma(auVar37,auVar36,auVar58);
    auVar37 = vpermi2ps_avx512vl(_DAT_003d14b0,auVar33,auVar36);
    auVar90._0_4_ = auVar35._0_4_ * auVar37._0_4_;
    auVar90._4_4_ = auVar35._4_4_ * auVar37._4_4_;
    auVar90._8_4_ = auVar35._8_4_ * auVar37._8_4_;
    auVar90._12_4_ = auVar35._12_4_ * auVar37._12_4_;
    auVar37 = vinsertps_avx(auVar35,auVar33,0x1c);
    auVar33 = vfmsub213ps_fma(auVar33,auVar36,auVar90);
    auVar32 = vinsertps_avx(auVar35,auVar36,0x4c);
    auVar37 = vfnmadd213ps_fma(auVar37,auVar32,auVar90);
    auVar81._0_4_ = auVar33._0_4_ + auVar37._0_4_;
    auVar81._4_4_ = auVar33._4_4_ + auVar37._4_4_;
    auVar81._8_4_ = auVar33._8_4_ + auVar37._8_4_;
    auVar81._12_4_ = auVar33._12_4_ + auVar37._12_4_;
    auVar55._0_4_ = auVar81._0_4_ * auVar81._0_4_;
    auVar55._4_4_ = auVar81._4_4_ * auVar81._4_4_;
    auVar55._8_4_ = auVar81._8_4_ * auVar81._8_4_;
    auVar55._12_4_ = auVar81._12_4_ * auVar81._12_4_;
    vhaddps_avx(auVar55,auVar55);
    auVar30 = vucomiss_avx512f(auVar30);
    if (bVar26) {
      fVar96 = sqrtf(auVar30._0_4_);
    }
    else {
      auVar30 = vsqrtss_avx(auVar30,auVar30);
      fVar96 = auVar30._0_4_;
    }
    auVar66._4_4_ = fVar96;
    auVar66._0_4_ = fVar96;
    auVar66._8_4_ = fVar96;
    auVar66._12_4_ = fVar96;
    local_178 = vdivps_avx(auVar81,auVar66);
    fVar96 = (auVar31._0_4_ + auVar58._0_4_) / fVar96;
    lVar7 = *(long *)(lVar22 + 0x18);
    uVar95 = local_178._8_4_;
    uVar1 = local_178._12_4_;
    if (lVar7 == 0) {
      if (*(char *)(lVar22 + 0x38) != *(char *)(lVar22 + 0x39)) {
        local_178._0_8_ = local_178._0_8_ ^ 0x8000000080000000;
        local_178._8_4_ = uVar95 ^ 0x80000000;
        local_178._12_4_ = uVar1 ^ 0x80000000;
        fVar96 = -fVar96;
      }
    }
    else {
      lVar22 = (long)*(int *)(lVar25 + lVar20 * 0xc);
      lVar21 = (long)*(int *)(lVar25 + 4 + lVar20 * 0xc);
      lVar25 = (long)*(int *)(lVar25 + 8 + lVar20 * 0xc);
      uVar3 = *(undefined8 *)(lVar7 + 4 + lVar22 * 0xc);
      uVar4 = *(undefined8 *)(lVar7 + 4 + lVar21 * 0xc);
      auVar67._8_8_ = 0;
      auVar67._0_8_ = *(ulong *)(lVar7 + 4 + lVar25 * 0xc);
      auVar30 = vmulps_avx512vl(auVar34,auVar67);
      auVar68._0_4_ = fVar45 * (float)uVar3 + fVar46 * (float)uVar4 + auVar30._0_4_;
      auVar68._4_4_ =
           fVar45 * (float)((ulong)uVar3 >> 0x20) + auVar59._4_4_ * (float)((ulong)uVar4 >> 0x20) +
           auVar30._4_4_;
      auVar68._8_4_ = fVar45 * 0.0 + auVar59._8_4_ * 0.0 + auVar30._8_4_;
      auVar68._12_4_ = fVar45 * 0.0 + auVar59._12_4_ * 0.0 + auVar30._12_4_;
      auVar30 = vmovshdup_avx(auVar68);
      fVar48 = fVar96 * auVar30._0_4_;
      auVar91._0_4_ = -fVar48;
      auVar91._4_4_ = 0x80000000;
      auVar91._8_4_ = 0x80000000;
      auVar91._12_4_ = 0x80000000;
      auVar37 = vpermi2ps_avx512vl(_DAT_003d14a0,local_178,ZEXT416((uint)fVar96));
      auVar30 = vinsertps_avx(ZEXT416((uint)fVar48),auVar91,0x10);
      auVar30 = vfmadd231ps_fma(auVar30,auVar68,auVar37);
      auVar30 = vhaddps_avx(auVar30,auVar30);
      auVar30 = vfmadd231ss_fma(auVar30,local_178,
                                ZEXT416((uint)(fVar45 * *(float *)(lVar7 + lVar22 * 0xc) +
                                               fVar46 * *(float *)(lVar7 + lVar21 * 0xc) +
                                              fVar47 * *(float *)(lVar7 + lVar25 * 0xc))));
      auVar76._0_12_ = ZEXT812(0);
      auVar76._12_4_ = 0;
      if (auVar30._0_4_ < 0.0) {
        local_178._0_8_ = local_178._0_8_ ^ 0x8000000080000000;
        local_178._8_4_ = uVar95 ^ 0x80000000;
        local_178._12_4_ = uVar1 ^ 0x80000000;
      }
      uVar3 = vcmpss_avx512f(auVar30,auVar76,1);
      bVar27 = (bool)((byte)uVar3 & 1);
      fVar96 = (float)((uint)bVar27 * (int)-fVar96 + (uint)!bVar27 * (int)fVar96);
    }
    Point3fi::Point3fi((Point3fi *)__return_storage_ptr__,(Point3f *)&local_40,
                       (Vector3f *)&local_b8.__align);
    FVar43 = ctx->time;
    __return_storage_ptr__->set = true;
    *(Float *)((long)&__return_storage_ptr__->optionalValue + 0x18) = FVar43;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x1c) = 0;
    *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x24) = 0;
    uVar3 = vmovlps_avx(local_178);
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = uVar3;
    *(float *)((long)&__return_storage_ptr__->optionalValue + 0x30) = fVar96;
    *(undefined1 (*) [16])((long)&__return_storage_ptr__->optionalValue + 0x34) = ZEXT816(0) << 0x20
    ;
    *(undefined1 (*) [16])((long)&__return_storage_ptr__->optionalValue + 0x40) = ZEXT816(0) << 0x20
    ;
    *(float *)((long)&__return_storage_ptr__->optionalValue + 0x50) = auVar29._0_4_ * local_188;
  }
  else {
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x50) = 0;
    *(undefined8 *)&__return_storage_ptr__->set = 0;
    (__return_storage_ptr__->optionalValue).__align = (anon_struct_8_0_00000001_for___align)0x0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU
    pstd::optional<ShapeSample> Sample(const ShapeSampleContext &ctx, Point2f u) const {
        // Get triangle vertices in _p0_, _p1_, and _p2_
        const TriangleMesh *mesh = GetMesh();
        const int *v = &mesh->vertexIndices[3 * triIndex];
        Point3f p0 = mesh->p[v[0]], p1 = mesh->p[v[1]], p2 = mesh->p[v[2]];

        // Use uniform area sampling for numerically unstable cases
        Float solidAngle = SolidAngle(ctx.p());
        if (solidAngle < MinSphericalSampleArea || solidAngle > MaxSphericalSampleArea) {
            // Uniformly sample shape and compute incident direction _wi_
            pstd::optional<ShapeSample> ss = Sample(u);
            DCHECK(ss.has_value());
            ss->intr.time = ctx.time;
            Vector3f wi = ss->intr.p() - ctx.p();
            if (LengthSquared(wi) == 0)
                return {};
            wi = Normalize(wi);

            // Convert uniform area sample PDF in _ss_ to solid angle measure
            ss->pdf /= AbsDot(ss->intr.n, -wi) / DistanceSquared(ctx.p(), ss->intr.p());
            if (IsInf(ss->pdf))
                return {};

            return ss;
        }

        // Sample spherical triangle from reference point
        // Apply warp product sampling for cosine factor at reference point
        Float pdf = 1;
        if (ctx.ns != Normal3f(0, 0, 0)) {
            // Compute $\cos \theta$-based weights _w_ at sample domain corners
            Point3f rp = ctx.p();
            Vector3f wi[3] = {Normalize(p0 - rp), Normalize(p1 - rp), Normalize(p2 - rp)};
            pstd::array<Float, 4> w =
                pstd::array<Float, 4>{std::max<Float>(0.01, AbsDot(ctx.ns, wi[1])),
                                      std::max<Float>(0.01, AbsDot(ctx.ns, wi[1])),
                                      std::max<Float>(0.01, AbsDot(ctx.ns, wi[0])),
                                      std::max<Float>(0.01, AbsDot(ctx.ns, wi[2]))};

            u = SampleBilinear(u, w);
            DCHECK(u[0] >= 0 && u[0] < 1 && u[1] >= 0 && u[1] < 1);
            pdf = BilinearPDF(u, w);
        }

        Float triPDF;
        pstd::array<Float, 3> b =
            SampleSphericalTriangle({p0, p1, p2}, ctx.p(), u, &triPDF);
        if (triPDF == 0)
            return {};
        pdf *= triPDF;

        // Compute error bounds _pError_ for sampled point on triangle
        Point3f pAbsSum = Abs(b[0] * p0) + Abs(b[1] * p1) + Abs((1 - b[0] - b[1]) * p2);
        Vector3f pError = Vector3f(gamma(6) * pAbsSum);

        // Return _ShapeSample_ for uniform solid angle sampled point on triangle
        Point3f p = b[0] * p0 + b[1] * p1 + b[2] * p2;
        // Compute surface normal for sampled point on triangle
        Normal3f n = Normalize(Normal3f(Cross(p1 - p0, p2 - p0)));
        if (mesh->n != nullptr) {
            Normal3f ns(b[0] * mesh->n[v[0]] + b[1] * mesh->n[v[1]] +
                        (1 - b[0] - b[1]) * mesh->n[v[2]]);
            n = FaceForward(n, ns);
        } else if (mesh->reverseOrientation ^ mesh->transformSwapsHandedness)
            n *= -1;

        return ShapeSample{Interaction(Point3fi(p, pError), n, ctx.time), pdf};
    }